

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_utility.h
# Opt level: O0

unsigned_short
imageio::bit_cast<unsigned_short,std::array<std::byte,2ul>>(array<std::byte,_2UL> *src)

{
  unsigned_short dst;
  array<std::byte,_2UL> *src_local;
  
  return *(unsigned_short *)src->_M_elems;
}

Assistant:

[[nodiscard]] constexpr inline To bit_cast(const From& src) noexcept {
    static_assert(sizeof(To) == sizeof(From));
    static_assert(std::is_trivially_copyable_v<From>);
    static_assert(std::is_trivially_copyable_v<To>);
    static_assert(std::is_trivially_constructible_v<To>);
    To dst;
    std::memcpy(&dst, &src, sizeof(To));
    return dst;
}